

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *A)

{
  long in_RSI;
  TPZManVector<int,_5> *in_RDI;
  TPZManVector<int,_5> *unaff_retaddr;
  TPZVec<std::complex<float>_> *in_stack_00000018;
  TPZVec<std::complex<float>_> *in_stack_00000020;
  void **in_stack_ffffffffffffffd8;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffffe0;
  TPZManVector<int,_5> *copy;
  
  copy = in_RDI;
  TPZMatrix<std::complex<float>_>::TPZMatrix
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (TPZMatrix<std::complex<float>_> *)in_RDI);
  (((TPZBaseMatrix *)&in_RDI->super_TPZVec<int>)->super_TPZSavable)._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_023de238;
  *(undefined8 *)in_RDI->fExtAlloc = *(undefined8 *)(in_RSI + 0x20);
  *(undefined8 *)(in_RDI->fExtAlloc + 2) = *(undefined8 *)(in_RSI + 0x28);
  *(undefined8 *)(in_RDI->fExtAlloc + 4) = *(undefined8 *)(in_RSI + 0x30);
  TPZManVector<int,_5>::TPZManVector(unaff_retaddr,copy);
  TPZVec<std::complex<float>_>::TPZVec(in_stack_00000020,in_stack_00000018);
  *(undefined8 *)(in_RSI + 0x20) = 0;
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(TPZFMatrix<TVar> &&A)
    : TPZMatrix<TVar>(A), fElem(A.fElem),
      fGiven(A.fGiven),fSize(A.fSize),
      fPivot(A.fPivot), fWork(A.fWork)
{
    A.fElem=nullptr;
    A.fGiven=nullptr;
    A.fSize=0;
}